

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printers_tests.cpp
# Opt level: O0

void __thiscall
iu_PrintToTest_x_iutest_x_Overload_Test::~iu_PrintToTest_x_iutest_x_Overload_Test
          (iu_PrintToTest_x_iutest_x_Overload_Test *this)

{
  iu_PrintToTest_x_iutest_x_Overload_Test *this_local;
  
  ~iu_PrintToTest_x_iutest_x_Overload_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(PrintToTest, Overload)
{
    Point0 p0 = { 0x12345678, 0x9ABCDEF0 };
    Point1 p1 = {0, 0};
    Point2 p2 = {1, 1};
    {
        PrintToLogChecker ck("8-Byte object < 78 56 34 12 F0 DE BC 9A >");
        IUTEST_PRINTTOSTRING_EQ(ck, p0);
        IUTEST_STREAMOUT_CHECK(p0);
    }
    {
        PrintToLogChecker ck("0, 0(operator overload)");
        IUTEST_PRINTTOSTRING_EQ(ck, p1);
        IUTEST_STREAMOUT_CHECK(p1);
    }
    {
        PrintToLogChecker ck("1, 1(function overload)");
        IUTEST_PRINTTOSTRING_EQ(ck, p2);
        IUTEST_STREAMOUT_CHECK(p2);
    }
}